

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O2

void testOptimizedInterleavePatterns(string *tempDir)

{
  ostream *poVar1;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  std::operator+(&bStack_28,tempDir,"imf_test_interleave_patterns.exr");
  std::__cxx11::string::operator=
            ((string *)&(anonymous_namespace)::filename_abi_cxx11_,(string *)&bStack_28);
  std::__cxx11::string::~string((string *)&bStack_28);
  uVar2 = 0x68;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing SSE optimisation with different interleave patterns (large images) ... "
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_235e13::runtests(false,(bool)uVar2);
  uVar2 = 0xb8;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing SSE optimisation with different interleave patterns (tiny images) ... "
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_235e13::runtests(true,(bool)uVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testOptimizedInterleavePatterns (const std::string& tempDir)
{
    filename = tempDir + "imf_test_interleave_patterns.exr";

    cout
        << "Testing SSE optimisation with different interleave patterns (large images) ... "
        << endl;
    runtests (false, false);

    cout
        << "Testing SSE optimisation with different interleave patterns (tiny images) ... "
        << endl;
    runtests (false, true);

    cout << "ok\n" << endl;
}